

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O0

void __thiscall spdlog::details::backtracer::push_back(backtracer *this,log_msg *msg)

{
  log_msg_buffer *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffe28;
  log_msg_buffer *item;
  circular_q<spdlog::details::log_msg_buffer> *in_stack_fffffffffffffe40;
  log_msg *in_stack_fffffffffffffe98;
  log_msg_buffer *in_stack_fffffffffffffea0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_fffffffffffffe28);
  item = (log_msg_buffer *)&(in_RDI->super_log_msg).color_range_end;
  log_msg_buffer::log_msg_buffer(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  circular_q<spdlog::details::log_msg_buffer>::push_back(in_stack_fffffffffffffe40,item);
  log_msg_buffer::~log_msg_buffer(in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x15ae4b);
  return;
}

Assistant:

SPDLOG_INLINE void backtracer::push_back(const log_msg &msg)
{
    std::lock_guard<std::mutex> lock{mutex_};
    messages_.push_back(log_msg_buffer{msg});
}